

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O2

void write_command_type(Context *ctx,CommandType type,Var cmdObj)

{
  undefined8 *puVar1;
  uint i;
  
  if (type < (AssertReturnCanonicalNan|AssertInvalid)) {
    write_string(ctx,cmdObj,0xb,
                 _ZZ18write_command_typePN10ChakraWabt7ContextEN4wabt11CommandTypeEPvE15s_command_names_rel
                 + *(int *)(
                           _ZZ18write_command_typePN10ChakraWabt7ContextEN4wabt11CommandTypeEPvE15s_command_names_rel
                           + (ulong)type * 4),0xffffffff);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "invalid command type";
  __cxa_throw(puVar1,&ChakraWabt::WabtAPIError::typeinfo,0);
}

Assistant:

void write_command_type(Context* ctx, CommandType type, Js::Var cmdObj)
{
    static const char* s_command_names[] = {
        "module",
        "action",
        "register",
        "assert_malformed",
        "assert_invalid",
        "assert_unlinkable",
        "assert_uninstantiable",
        "assert_return",
        "assert_return_canonical_nan",
        "assert_return_arithmetic_nan",
        "assert_trap",
        "assert_exhaustion",
    };
    WABT_STATIC_ASSERT(sizeof(s_command_names) / sizeof(char*) == (int)CommandType::Last + 1);
    uint i = (uint)type;
    if (i > (uint)CommandType::Last)
    {
        throw WabtAPIError("invalid command type");
    }
    write_string(ctx, cmdObj, PropertyIds::type, s_command_names[i]);
}